

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *type,AccessChainFlags flags,
          bool *param_5,uint32_t index)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  uint32_t uVar5;
  string local_48;
  
  ::std::__cxx11::string::append((char *)expr);
  bVar3 = Compiler::has_decoration(&this->super_Compiler,(ID)index,DecorationNonUniform);
  if ((bVar3) &&
     ((bVar3 = Compiler::has_decoration
                         (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock),
      bVar3 || (bVar3 = Compiler::has_decoration
                                  (&this->super_Compiler,(ID)(type->super_IVariant).self.id,
                                   DecorationBufferBlock), bVar3)))) {
    ::std::__cxx11::string::append((char *)expr);
    ::std::__cxx11::string::append((char *)expr);
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  if ((flags & 1) == 0) {
    to_expression_abi_cxx11_(&local_48,this,index,(flags & 8) == 0);
    ::std::__cxx11::string::_M_append((char *)expr,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_001d09f8;
  }
  else {
    cVar4 = '\x01';
    if (9 < index) {
      uVar5 = index;
      cVar2 = '\x04';
      do {
        cVar4 = cVar2;
        if (uVar5 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_001d09b5;
        }
        if (uVar5 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_001d09b5;
        }
        if (uVar5 < 10000) goto LAB_001d09b5;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar2 = cVar4 + '\x04';
      } while (bVar1);
      cVar4 = cVar4 + '\x01';
    }
LAB_001d09b5:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,index);
    ::std::__cxx11::string::_M_append((char *)expr,(ulong)local_48._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_001d09f8;
  }
  operator_delete(local_48._M_dataplus._M_p);
LAB_001d09f8:
  if (bVar3) {
    ::std::__cxx11::string::append((char *)expr);
  }
  ::std::__cxx11::string::append((char *)expr);
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType *type,
                                                      AccessChainFlags flags, bool & /*access_chain_is_arrayed*/,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	expr += "[";

	// If we are indexing into an array of SSBOs or UBOs, we need to index it with a non-uniform qualifier.
	bool nonuniform_index =
	    has_decoration(index, DecorationNonUniformEXT) &&
	    (has_decoration(type->self, DecorationBlock) || has_decoration(type->self, DecorationBufferBlock));
	if (nonuniform_index)
	{
		expr += backend.nonuniform_qualifier;
		expr += "(";
	}

	if (index_is_literal)
		expr += convert_to_string(index);
	else
		expr += to_expression(index, register_expression_read);

	if (nonuniform_index)
		expr += ")";

	expr += "]";
}